

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O1

int run_test_dlerror(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *unaff_RBX;
  undefined1 auStack_e8 [8];
  undefined1 auStack_e0 [40];
  undefined1 auStack_b8 [152];
  char *pcStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  pcStack_20 = (char *)0x1568bf;
  pcVar2 = (char *)uv_dlerror();
  if (pcVar2 == (char *)0x0) {
    pcStack_20 = (char *)0x156981;
    run_test_dlerror_cold_9();
LAB_00156981:
    pcStack_20 = (char *)0x156986;
    run_test_dlerror_cold_8();
LAB_00156986:
    pcStack_20 = (char *)0x15698b;
    run_test_dlerror_cold_1();
LAB_0015698b:
    pcStack_20 = (char *)0x156990;
    run_test_dlerror_cold_7();
LAB_00156990:
    pcStack_20 = (char *)0x156995;
    run_test_dlerror_cold_6();
LAB_00156995:
    pcStack_20 = (char *)0x15699d;
    run_test_dlerror_cold_2();
LAB_0015699d:
    pcVar2 = unaff_RBX;
    pcStack_20 = (char *)0x1569a2;
    run_test_dlerror_cold_5();
LAB_001569a2:
    pcStack_20 = (char *)0x1569a7;
    run_test_dlerror_cold_4();
  }
  else {
    pcStack_20 = (char *)0x1568d7;
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 == (char *)0x0) goto LAB_00156981;
    pcStack_20 = (char *)0x1568ef;
    iVar1 = uv_dlopen("test/fixtures/load_error.node",&local_18);
    if (iVar1 != -1) goto LAB_00156986;
    pcStack_20 = (char *)0x156900;
    pcVar2 = (char *)uv_dlerror(&local_18);
    if (pcVar2 == (char *)0x0) goto LAB_0015698b;
    pcStack_20 = (char *)0x15691b;
    pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
    unaff_RBX = pcVar2;
    if (pcVar3 == (char *)0x0) goto LAB_00156990;
    pcStack_20 = (char *)0x15692f;
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 != (char *)0x0) goto LAB_00156995;
    pcStack_20 = (char *)0x15693c;
    pcVar2 = (char *)uv_dlerror(&local_18);
    if (pcVar2 == (char *)0x0) goto LAB_0015699d;
    pcStack_20 = (char *)0x156953;
    pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
    if (pcVar3 == (char *)0x0) goto LAB_001569a2;
    pcStack_20 = (char *)0x156967;
    pcVar3 = strstr(pcVar2,"no error");
    if (pcVar3 == (char *)0x0) {
      pcStack_20 = (char *)0x156974;
      uv_dlclose(&local_18);
      return 0;
    }
  }
  pcStack_20 = (char *)0x1569af;
  run_test_dlerror_cold_3();
  pcStack_20 = pcVar2;
  iov = (uv_buf_t)uv_buf_init(buf,0x20);
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_signal_init(loop,auStack_b8);
  if (iVar1 == 0) {
    iVar1 = uv_signal_start(auStack_b8,sig_func,10);
    if (iVar1 != 0) goto LAB_00156b2e;
    iVar1 = pipe(pipe_fds);
    if (iVar1 != 0) goto LAB_00156b33;
    iVar1 = uv_thread_create(auStack_e8,thread_main,auStack_e0);
    if (iVar1 != 0) goto LAB_00156b38;
    iVar1 = uv_fs_read(loop,&read_req,pipe_fds[0],&iov,1,0xffffffffffffffff,0);
    if (iVar1 != 0xd) goto LAB_00156b3d;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00156b42;
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00156b47;
    iVar1 = close(pipe_fds[0]);
    if (iVar1 != 0) goto LAB_00156b4c;
    iVar1 = close(pipe_fds[1]);
    if (iVar1 == 0) {
      uv_close(auStack_b8,0);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto <EXTERNAL>_uv_signal_stop;
    }
  }
  else {
    run_test_eintr_handling_cold_1();
LAB_00156b2e:
    run_test_eintr_handling_cold_2();
LAB_00156b33:
    run_test_eintr_handling_cold_3();
LAB_00156b38:
    run_test_eintr_handling_cold_4();
LAB_00156b3d:
    run_test_eintr_handling_cold_5();
LAB_00156b42:
    run_test_eintr_handling_cold_6();
LAB_00156b47:
    run_test_eintr_handling_cold_7();
LAB_00156b4c:
    run_test_eintr_handling_cold_8();
  }
  run_test_eintr_handling_cold_9();
<EXTERNAL>_uv_signal_stop:
  run_test_eintr_handling_cold_10();
  iVar1 = uv_signal_stop();
  return iVar1;
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
  ASSERT_NOT_NULL(strstr(msg, dlerror_no_error));

  r = uv_dlopen(path, &lib);
  ASSERT(r == -1);

  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  uv_dlclose(&lib);

  return 0;
}